

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

HighsTask * __thiscall HighsSplitDeque::randomSteal(HighsSplitDeque *this)

{
  HighsInt HVar1;
  HighsTask *pHVar2;
  
  HVar1 = HighsRandom::integer(&(this->ownerData).randgen,(this->ownerData).numWorkers + -1);
  pHVar2 = steal((this->ownerData).workers
                 [(int)((uint)((this->ownerData).ownerId <= HVar1) + HVar1)]._M_t.
                 super___uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                 .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl);
  return pHVar2;
}

Assistant:

HighsTask* randomSteal() {
    HighsInt next = ownerData.randgen.integer(ownerData.numWorkers - 1);
    next += next >= ownerData.ownerId;
    assert(next != ownerData.ownerId);
    assert(next >= 0);
    assert(next < ownerData.numWorkers);

    return ownerData.workers[next]->steal();
  }